

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O0

BOOL Internal_AddPaddingW(LPWSTR *Out,INT Count,LPWSTR In,INT Padding,INT Flags)

{
  LPWSTR pWVar1;
  LPWSTR pWVar2;
  bool bVar3;
  int iVar4;
  errno_t eVar5;
  size_t sVar6;
  long local_90;
  size_t local_88;
  int local_60;
  int local_5c;
  int local_3c;
  INT LengthInStr;
  INT PaddingOriginal;
  LPWSTR OutOriginal;
  INT Flags_local;
  INT Padding_local;
  LPWSTR In_local;
  INT Count_local;
  LPWSTR *Out_local;
  
  pWVar1 = *Out;
  sVar6 = PAL_wcslen(In);
  iVar4 = (int)sVar6;
  local_3c = Padding;
  if (Padding < 0) {
    local_3c = 0;
  }
  if ((Flags & 1U) != 0) {
    if (iVar4 + 1 < Count + -1) {
      local_5c = iVar4 + 1;
    }
    else {
      local_5c = Count + -1;
    }
    eVar5 = wcsncpy_s((char16_t_conflict *)*Out,(long)Count,(char16_t_conflict *)In,(long)local_5c);
    if (eVar5 != 0) {
      return 0;
    }
    local_60 = iVar4;
    if (Count + -1 <= iVar4) {
      local_60 = Count + -1;
    }
    *Out = *Out + local_60;
  }
  if (0 < Padding) {
    OutOriginal._4_4_ = Padding;
    if ((Flags & 4U) == 0) {
      while( true ) {
        bVar3 = false;
        if (OutOriginal._4_4_ != 0) {
          bVar3 = (long)*Out - (long)pWVar1 >> 1 < (long)Count;
        }
        if (!bVar3) break;
        pWVar2 = *Out;
        *Out = pWVar2 + 1;
        *pWVar2 = L' ';
        OutOriginal._4_4_ = OutOriginal._4_4_ + -1;
      }
    }
    else {
      while( true ) {
        bVar3 = false;
        if (OutOriginal._4_4_ != 0) {
          bVar3 = (long)*Out - (long)pWVar1 >> 1 < (long)Count;
        }
        if (!bVar3) break;
        pWVar2 = *Out;
        *Out = pWVar2 + 1;
        *pWVar2 = L'0';
        OutOriginal._4_4_ = OutOriginal._4_4_ + -1;
      }
    }
  }
  if ((Flags & 1U) == 0) {
    if ((long)iVar4 < ((long)Count - ((long)*Out - (long)pWVar1 >> 1)) + -1) {
      local_88 = (size_t)iVar4;
    }
    else {
      local_88 = ((long)Count - ((long)*Out - (long)pWVar1 >> 1)) - 1;
    }
    eVar5 = wcsncpy_s((char16_t_conflict *)*Out,(long)Count - ((long)*Out - (long)pWVar1 >> 1),
                      (char16_t_conflict *)In,local_88);
    if (eVar5 != 0) {
      return 0;
    }
    if ((long)iVar4 < ((long)Count - ((long)*Out - (long)pWVar1 >> 1)) + -1) {
      local_90 = (long)iVar4;
    }
    else {
      local_90 = ((long)Count - ((long)*Out - (long)pWVar1 >> 1)) + -1;
    }
    *Out = *Out + local_90;
  }
  Out_local._4_4_ = (uint)(iVar4 + local_3c <= Count + -1);
  return Out_local._4_4_;
}

Assistant:

BOOL Internal_AddPaddingW(LPWSTR *Out, INT Count, LPWSTR In, INT Padding, INT Flags)
{
    LPWSTR OutOriginal = *Out;
    INT PaddingOriginal = Padding;
    INT LengthInStr;
    LengthInStr = PAL_wcslen(In);


    if (Padding < 0)
    {
        /* this is used at the bottom to determine if the buffer ran out */
        PaddingOriginal = 0;
    }
    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (wcsncpy_s(*Out, Count, In, min(LengthInStr + 1, Count - 1)) != SAFECRT_SUCCESS)
        {
            return FALSE;
        }

        *Out += min(LengthInStr, Count - 1);
    }
    if (Padding > 0)
    {
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding-- && Count > *Out - OutOriginal)
            {
                *(*Out)++ = '0';
            }
        }
        else /* pad left with spaces */
        {
            while (Padding-- && Count > *Out - OutOriginal)
            {
                *(*Out)++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (wcsncpy_s(*Out, Count - (*Out - OutOriginal), In,
            min(LengthInStr, Count - (*Out - OutOriginal) - 1)) != SAFECRT_SUCCESS)
        {
            return FALSE;
        }

        *Out += min(LengthInStr, Count - (*Out - OutOriginal) - 1);
    }

    if (LengthInStr + PaddingOriginal > Count - 1)
    {
        return FALSE;
    }
    else
    {
        return TRUE;
    }
}